

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall dmlc::LogMessageFatal::LogMessageFatal(LogMessageFatal *this,char *file,int line)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
  __s = DateLogger::HumanDate(&this->pretty_date_);
  if (__s == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"] ",2);
  if (file == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":",1);
  poVar2 = (ostream *)std::ostream::operator<<(this,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  return;
}

Assistant:

LogMessageFatal(const char *file, int line) {
    log_stream_ << "[" << pretty_date_.HumanDate() << "] " << file << ":"
                << line << ": ";
  }